

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O1

int __thiscall
HEVCStreamReader::writeAdditionData
          (HEVCStreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  uint8_t *__src;
  uint8_t *puVar1;
  size_t __n;
  
  __n = (size_t)avPacket->size;
  puVar1 = dstBuffer;
  if (((4 < (long)__n) && ((long)__n < (long)dstEnd - (long)dstBuffer)) &&
     (__src = avPacket->data, (__src[4 - (ulong)(__src[2] == '\x01')] & 0x7e) == 0x46)) {
    memcpy(dstBuffer,__src,__n);
    puVar1 = dstBuffer + avPacket->size;
    avPacket->size = 0;
    avPacket->data = (uint8_t *)0x0;
  }
  if (((avPacket->flags & 0x20) == 0 & this->m_firstFileFrame) == 1) {
    avPacket->flags = avPacket->flags | 0x20;
    puVar1 = writeBuffer(this,&this->m_vpsBuffer,puVar1,dstEnd);
    puVar1 = writeBuffer(this,&this->m_spsBuffer,puVar1,dstEnd);
    puVar1 = writeBuffer(this,&this->m_ppsBuffer,puVar1,dstEnd);
  }
  this->m_firstFileFrame = false;
  return (int)puVar1 - (int)dstBuffer;
}

Assistant:

int HEVCStreamReader::writeAdditionData(uint8_t* dstBuffer, uint8_t* dstEnd, AVPacket& avPacket,
                                        PriorityDataInfo* priorityData)
{
    uint8_t* curPos = dstBuffer;

    if (avPacket.size > 4 && avPacket.size < dstEnd - dstBuffer)
    {
        const int offset = avPacket.data[2] == 1 ? 3 : 4;
        const auto nalType = static_cast<HevcUnit::NalType>((avPacket.data[offset] >> 1) & 0x3f);
        if (nalType == HevcUnit::NalType::AUD)
        {
            // place delimiter at first place
            memcpy(curPos, avPacket.data, avPacket.size);
            curPos += avPacket.size;
            avPacket.size = 0;
            avPacket.data = nullptr;
        }
    }

    const bool needInsSpsPps = m_firstFileFrame && !(avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP);
    if (needInsSpsPps)
    {
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

        curPos = writeBuffer(m_vpsBuffer, curPos, dstEnd);
        curPos = writeBuffer(m_spsBuffer, curPos, dstEnd);
        curPos = writeBuffer(m_ppsBuffer, curPos, dstEnd);
    }

    m_firstFileFrame = false;
    return static_cast<int>(curPos - dstBuffer);
}